

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

void __thiscall
kj::_::DisposableOwnedBundle<kj::Own<kj::_::ChainPromiseNode,_kj::_::PromiseDisposer>_>::disposeImpl
          (DisposableOwnedBundle<kj::Own<kj::_::ChainPromiseNode,_kj::_::PromiseDisposer>_> *this,
          void *pointer)

{
  void *pointer_local;
  DisposableOwnedBundle<kj::Own<kj::_::ChainPromiseNode,_kj::_::PromiseDisposer>_> *this_local;
  
  if (this != (DisposableOwnedBundle<kj::Own<kj::_::ChainPromiseNode,_kj::_::PromiseDisposer>_> *)
              0x0) {
    ~DisposableOwnedBundle(this);
    operator_delete(this,0x10);
  }
  return;
}

Assistant:

void disposeImpl(void* pointer) const override { delete this; }